

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildSetupFont
               (ImFontAtlas *atlas,ImFont *font,ImFontConfig *font_config,float ascent,float descent
               )

{
  int iVar1;
  Glyph *__src;
  Glyph *__dest;
  uint uVar2;
  ulong uVar3;
  
  if (font_config->MergeMode == false) {
    font->ContainerAtlas = atlas;
    font->ConfigData = font_config;
    font->ConfigDataCount = 0;
    font->FontSize = font_config->SizePixels;
    font->Ascent = ascent;
    font->Descent = descent;
    iVar1 = (font->Glyphs).Capacity;
    if (iVar1 < 0) {
      uVar2 = iVar1 / 2 + iVar1;
      uVar3 = 0;
      if (0 < (int)uVar2) {
        uVar3 = (ulong)uVar2;
      }
      __dest = (Glyph *)ImGui::MemAlloc(uVar3 * 0x28);
      __src = (font->Glyphs).Data;
      if (__src != (Glyph *)0x0) {
        memcpy(__dest,__src,(long)(font->Glyphs).Size * 0x28);
      }
      ImGui::MemFree((font->Glyphs).Data);
      (font->Glyphs).Data = __dest;
      (font->Glyphs).Capacity = (int)uVar3;
    }
    (font->Glyphs).Size = 0;
    font->MetricsTotalSurface = 0;
  }
  font->ConfigDataCount = font->ConfigDataCount + 1;
  return;
}

Assistant:

void ImFontAtlasBuildSetupFont(ImFontAtlas* atlas, ImFont* font, ImFontConfig* font_config, float ascent, float descent)
{
    if (!font_config->MergeMode)
    {
        font->ContainerAtlas = atlas;
        font->ConfigData = font_config;
        font->ConfigDataCount = 0;
        font->FontSize = font_config->SizePixels;
        font->Ascent = ascent;
        font->Descent = descent;
        font->Glyphs.resize(0);
        font->MetricsTotalSurface = 0;
    }
    font->ConfigDataCount++;
}